

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateInfo.hpp
# Opt level: O1

void __thiscall helics::FederateInfo::FederateInfo(FederateInfo *this,FederateInfo *param_1)

{
  pointer pcVar1;
  CoreType CVar2;
  int iVar3;
  char cVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  
  std::
  vector<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
  ::vector((vector<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
            *)this,(vector<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                    *)param_1);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            (&(this->super_CoreFederateInfo).intProps,&(param_1->super_CoreFederateInfo).intProps);
  std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>::vector
            (&(this->super_CoreFederateInfo).flagProps,&(param_1->super_CoreFederateInfo).flagProps)
  ;
  *(undefined4 *)((long)&this->brokerPort + 3) = *(undefined4 *)((long)&param_1->brokerPort + 3);
  cVar4 = param_1->separator;
  bVar5 = param_1->autobroker;
  bVar6 = param_1->debugging;
  bVar7 = param_1->observer;
  CVar2 = param_1->coreType;
  iVar3 = param_1->brokerPort;
  this->uniqueKey = param_1->uniqueKey;
  this->separator = cVar4;
  this->autobroker = bVar5;
  this->debugging = bVar6;
  this->observer = bVar7;
  this->coreType = CVar2;
  this->brokerPort = iVar3;
  (this->profilerFileName)._M_dataplus._M_p = (pointer)&(this->profilerFileName).field_2;
  pcVar1 = (param_1->profilerFileName)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->profilerFileName,pcVar1,
             pcVar1 + (param_1->profilerFileName)._M_string_length);
  (this->encryptionConfig)._M_dataplus._M_p = (pointer)&(this->encryptionConfig).field_2;
  pcVar1 = (param_1->encryptionConfig)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->encryptionConfig,pcVar1,
             pcVar1 + (param_1->encryptionConfig)._M_string_length);
  (this->defName)._M_dataplus._M_p = (pointer)&(this->defName).field_2;
  pcVar1 = (param_1->defName)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->defName,pcVar1,pcVar1 + (param_1->defName)._M_string_length);
  (this->coreName)._M_dataplus._M_p = (pointer)&(this->coreName).field_2;
  pcVar1 = (param_1->coreName)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->coreName,pcVar1,pcVar1 + (param_1->coreName)._M_string_length);
  (this->coreInitString)._M_dataplus._M_p = (pointer)&(this->coreInitString).field_2;
  pcVar1 = (param_1->coreInitString)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->coreInitString,pcVar1,
             pcVar1 + (param_1->coreInitString)._M_string_length);
  (this->brokerInitString)._M_dataplus._M_p = (pointer)&(this->brokerInitString).field_2;
  pcVar1 = (param_1->brokerInitString)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->brokerInitString,pcVar1,
             pcVar1 + (param_1->brokerInitString)._M_string_length);
  (this->broker)._M_dataplus._M_p = (pointer)&(this->broker).field_2;
  pcVar1 = (param_1->broker)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->broker,pcVar1,pcVar1 + (param_1->broker)._M_string_length);
  (this->key)._M_dataplus._M_p = (pointer)&(this->key).field_2;
  pcVar1 = (param_1->key)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->key,pcVar1,pcVar1 + (param_1->key)._M_string_length);
  (this->localport)._M_dataplus._M_p = (pointer)&(this->localport).field_2;
  pcVar1 = (param_1->localport)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->localport,pcVar1,pcVar1 + (param_1->localport)._M_string_length);
  (this->configString)._M_dataplus._M_p = (pointer)&(this->configString).field_2;
  pcVar1 = (param_1->configString)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->configString,pcVar1,pcVar1 + (param_1->configString)._M_string_length)
  ;
  this->fileInUse = param_1->fileInUse;
  return;
}

Assistant:

class HELICS_CXX_EXPORT FederateInfo: public CoreFederateInfo {
  public:
    int uniqueKey{0};  //!< location for keying the info for application purposes
    char separator{'/'};  //!< separator for global name of localFederates
    bool autobroker{
        false};  //!< specify that the core should generate a broker if not found otherwise
    /** specify that the core/federate should operate in a user debugging
    mode which will turn off some timeouts*/
    bool debugging{false};
    bool observer{false};
    CoreType coreType{CoreType::DEFAULT};  //!< the type of the core
    int brokerPort{-1};  //!< broker port information

    bool forceNewCore{false};  //!< indicator that the federate should not use an existing core
    /** indicate that the federate should use json serialization for all data transfers*/
    bool useJsonSerialization{false};
    /** specify that the core should use encryption*/
    bool encrypted{false};
    /** specify that the federate and associated core should enable profiling to the specified
     * file*/
    std::string profilerFileName;
    std::string encryptionConfig;  //!< encryption configuration string or file
    std::string defName;  //!< a default name to use for a federate
    std::string coreName;  //!< the name of the core
    std::string coreInitString;  //!< an initialization string for the core API object
    std::string brokerInitString;  //!< an initialization string for the broker if auto generated
    std::string broker;  //!< connection information for the broker
    std::string key;  //!< key for the broker
    std::string localport;  //!< string for defining the local port to use usually a number but
                            //!< other strings are possible

    std::string configString;  //!< storage for config file name or string
    bool fileInUse{false};
    /** default constructor*/
    FederateInfo();
    /** construct from a type
    @param cType the type of core to use for the federate*/
    explicit FederateInfo(CoreType cType);
    /** load a federateInfo object from command line arguments in a string
    @details calls /ref loadInfoFromArgs in the constructor
    @param args a string containing the command line arguments
    */
    explicit FederateInfo(const std::string& args);
    /** load a federateInfo object from command line arguments
    @details calls /ref loadInfoFromArgs in the constructor
    @param argc the number of arguments
    @param argv an array of char * pointers to the arguments
    */
    FederateInfo(int argc, char* argv[]);
    /** load a federateInfo object from arguments stored in a vector
    @details calls /ref loadInfoFromArgs in the constructor
    @param[in,out] args a vector of arguments to load.  The unused arguments will be returned in the
    vector
    */
    explicit FederateInfo(std::vector<std::string>& args);
    /** load a federateInfo object from command line arguments outside the constructor
   @param args a string containing the command line arguments
   @return a vector of strings containing the unused arguments
   */
    std::vector<std::string> loadInfoFromArgs(const std::string& args);
    /** load a federateInfo object from command line arguments outside the constructor
    @param argc the number of arguments
    @param argv an array of char * pointers to the arguments
    @return a vector of strings containing the unused arguments
    */
    std::vector<std::string> loadInfoFromArgs(int argc, char* argv[]);
    /** load a federateInfo object from command line arguments contained in a vector
    @param[in,out] args a vector of arguments to load.  The unused arguments will be returned in the
    vector
    */
    void loadInfoFromArgs(std::vector<std::string>& args);
    /** load a federateInfo object from command line arguments outside the constructor
 @param args a string containing the command line arguments
 */
    void loadInfoFromArgsIgnoreOutput(const std::string& args);
    /** load a federateInfo object from command line arguments outside the constructor
    @param argc the number of arguments
    @param argv an array of char * pointers to the arguments
    */
    void loadInfoFromArgsIgnoreOutput(int argc, char* argv[]);

    /** load a federateInfo object from a toml string either a file or toml string
    @param toml a string containing the name of the toml file or toml contents
    */
    void loadInfoFromToml(const std::string& toml, bool runArgParser = true);

    /** load a federateInfo object from a JSON string either a file or JSON string
  @param json a string containing the name of the JSON file or JSON contents
  */
    void loadInfoFromJson(const std::string& json, bool runArgParser = true);

    /** check if a property has been set and return its value*/
    Time checkTimeProperty(int propId, Time defVal) const;
    bool checkFlagProperty(int propId, bool defVal) const;
    int checkIntProperty(int propId, int defVal) const;

    /** inject the federateInfo parser into another CLI11 App*/
    void injectParser(CLI::App* app);

  private:
    std::unique_ptr<helicsCLI11App> makeCLIApp();
    /** do some additional configuration from config files */
    void config_additional(CLI::App* app);
    /** method for loading info from json*/
    void loadJsonConfig(const fileops::JsonBuffer& json);
}